

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

uint __thiscall
Js::ScriptContext::SaveSourceNoCopy
          (ScriptContext *this,Utf8SourceInfo *sourceInfo,int cchLength,bool isCesu8)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ScriptContext *pSVar4;
  undefined4 *puVar5;
  Recycler *this_00;
  ThreadContext *this_01;
  CriticalSection *cs;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *this_02;
  AutoCriticalSection local_30;
  AutoCriticalSection autocs;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceWeakRef;
  bool isCesu8_local;
  int cchLength_local;
  Utf8SourceInfo *sourceInfo_local;
  ScriptContext *this_local;
  
  pSVar4 = Utf8SourceInfo::GetScriptContext(sourceInfo);
  if (pSVar4 != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xadf,"(sourceInfo->GetScriptContext() == this)",
                                "sourceInfo->GetScriptContext() == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IsScriptContextInDebugMode(this);
  if (((bVar2) && (bVar2 = Utf8SourceInfo::GetIsLibraryCode(sourceInfo), !bVar2)) &&
     (bVar2 = Utf8SourceInfo::IsInDebugMode(sourceInfo), !bVar2)) {
    Utf8SourceInfo::SetInDebugMode(sourceInfo,true);
  }
  this_00 = GetRecycler(this);
  autocs.cs = (CriticalSection *)
              Memory::Recycler::CreateWeakReferenceHandle<Js::Utf8SourceInfo>(this_00,sourceInfo);
  Utf8SourceInfo::SetIsCesu8(sourceInfo,isCesu8);
  this_01 = GetThreadContext(this);
  cs = ThreadContext::GetFunctionBodyLock(this_01);
  AutoCriticalSection::AutoCriticalSection(&local_30,cs);
  this_02 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  uVar3 = JsUtil::
          List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
          ::SetAtFirstFreeSpot(this_02,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&autocs);
  AutoCriticalSection::~AutoCriticalSection(&local_30);
  return uVar3;
}

Assistant:

uint ScriptContext::SaveSourceNoCopy(Utf8SourceInfo* sourceInfo, int cchLength, bool isCesu8)
    {
        Assert(sourceInfo->GetScriptContext() == this);

#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsScriptContextInDebugMode() && !sourceInfo->GetIsLibraryCode() && !sourceInfo->IsInDebugMode())
        {
            sourceInfo->SetInDebugMode(true);
        }
#endif

        RecyclerWeakReference<Utf8SourceInfo>* sourceWeakRef = this->GetRecycler()->CreateWeakReferenceHandle<Utf8SourceInfo>(sourceInfo);
        sourceInfo->SetIsCesu8(isCesu8);
        {
            // We can be compiling new source code while rundown thread is reading from the list, causing AV on the reader thread
            // lock the list during write as well.
            AutoCriticalSection autocs(GetThreadContext()->GetFunctionBodyLock());
            return sourceList->SetAtFirstFreeSpot(sourceWeakRef);
        }
    }